

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  ostream *poVar1;
  ConsoleReporter *in_RSI;
  TestGroupStats *in_RDI;
  Totals *in_stack_00000548;
  ConsoleReporter *in_stack_00000550;
  
  if ((in_RDI[1].groupInfo.name._M_string_length & 1) != 0) {
    printSummaryDivider(in_RSI);
    poVar1 = std::operator<<((ostream *)(in_RDI->groupInfo).name.field_2._M_allocated_capacity,
                             "Summary for group \'");
    poVar1 = std::operator<<(poVar1,(string *)
                                    &(in_RSI->super_StreamingReporterBase<Catch::ConsoleReporter>).
                                     m_config);
    std::operator<<(poVar1,"\':\n");
    printTotals(in_stack_00000550,in_stack_00000548);
    poVar1 = std::operator<<((ostream *)(in_RDI->groupInfo).name.field_2._M_allocated_capacity,'\n')
    ;
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  StreamingReporterBase<Catch::ConsoleReporter>::testGroupEnded
            (&in_RSI->super_StreamingReporterBase<Catch::ConsoleReporter>,in_RDI);
  return;
}

Assistant:

void ConsoleReporter::testGroupEnded(TestGroupStats const& _testGroupStats) {
    if (currentGroupInfo.used) {
        printSummaryDivider();
        stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
        printTotals(_testGroupStats.totals);
        stream << '\n' << std::endl;
    }
    StreamingReporterBase::testGroupEnded(_testGroupStats);
}